

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O0

void google::protobuf::compiler::java::anon_unknown_0::MaybeRestartJavaMethod
               (Printer *printer,int *bytecode_estimate,int *method_num,char *chain_statement,
               char *method_decl)

{
  int *in_RDX;
  int *in_RSI;
  AlphaNum *in_RDI;
  undefined8 in_stack_fffffffffffffee8;
  AlphaNum *in_stack_fffffffffffffef0;
  AlphaNum *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  Printer *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  Printer *in_stack_ffffffffffffff50;
  string local_a8 [96];
  string local_48 [56];
  int *local_10;
  AlphaNum *local_8;
  
  if (0x8000 < *in_RSI) {
    *in_RDX = *in_RDX + 1;
    local_10 = in_RSI;
    local_8 = in_RDI;
    strings::AlphaNum::AlphaNum
              (in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
    StrCat_abi_cxx11_(in_stack_ffffffffffffff28);
    io::Printer::Print<char[11],std::__cxx11::string>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               &in_stack_ffffffffffffff40->variable_delimiter_,in_stack_ffffffffffffff38);
    std::__cxx11::string::~string(local_48);
    io::Printer::Outdent(in_stack_ffffffffffffff50);
    io::Printer::Print<>(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
    strings::AlphaNum::AlphaNum(local_8,(int)((ulong)&stack0xffffffffffffff28 >> 0x20));
    StrCat_abi_cxx11_(in_stack_ffffffffffffff28);
    io::Printer::Print<char[11],std::__cxx11::string>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
               &in_stack_ffffffffffffff40->variable_delimiter_,in_stack_ffffffffffffff38);
    std::__cxx11::string::~string(local_a8);
    io::Printer::Indent((Printer *)0x5325f2);
    *local_10 = 0;
  }
  return;
}

Assistant:

void MaybeRestartJavaMethod(io::Printer* printer, int* bytecode_estimate,
                            int* method_num, const char* chain_statement,
                            const char* method_decl) {
  // The goal here is to stay under 64K bytes of jvm bytecode/method,
  // since otherwise we hit a hardcoded limit in the jvm and javac will
  // then fail with the error "code too large". This limit lets our
  // estimates be off by a factor of two and still we're okay.
  static const int bytesPerMethod = kMaxStaticSize;

  if ((*bytecode_estimate) > bytesPerMethod) {
    ++(*method_num);
    printer->Print(chain_statement, "method_num", StrCat(*method_num));
    printer->Outdent();
    printer->Print("}\n");
    printer->Print(method_decl, "method_num", StrCat(*method_num));
    printer->Indent();
    *bytecode_estimate = 0;
  }
}